

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O1

void __thiscall flow::util::RegExp::RegExp(RegExp *this,RegExp *v)

{
  pointer pcVar1;
  
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  pcVar1 = (v->pattern_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (v->pattern_)._M_string_length);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&this->re_,&v->re_);
  return;
}

Assistant:

RegExp::RegExp(const RegExp& v)
    : pattern_(v.pattern_), re_(v.re_) {
}